

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
OneVar_LoadStructWithOneStringVariable_StringBraces_Test::
~OneVar_LoadStructWithOneStringVariable_StringBraces_Test
          (OneVar_LoadStructWithOneStringVariable_StringBraces_Test *this)

{
  OneVar_LoadStructWithOneStringVariable_StringBraces_Test *this_local;
  
  ~OneVar_LoadStructWithOneStringVariable_StringBraces_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OneVar, LoadStructWithOneStringVariable_StringBraces) {
	one_string_var v;
	const char* json_str = "{\n"
						   "	\"val\": \"Simple {} string\"\n"
						   "}\n";
	EXPECT_TRUE(JSON_OK == load_object_from_string(json_str, v));
	EXPECT_TRUE(v.val == "Simple {} string");
}